

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::ClassDataType_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor,Options *options)

{
  Options *options_00;
  bool bVar1;
  FileDescriptor *pFVar2;
  size_type sVar3;
  string_view local_60;
  unsigned_long local_50;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355> local_48 [2];
  byte local_22;
  allocator<char> local_21;
  Options *local_20;
  Options *options_local;
  Descriptor *descriptor_local;
  
  local_20 = (Options *)descriptor;
  options_local = (Options *)this;
  descriptor_local = (Descriptor *)__return_storage_ptr__;
  pFVar2 = Descriptor::file((Descriptor *)this);
  bVar1 = HasDescriptorMethods(pFVar2,local_20);
  options_00 = local_20;
  local_22 = 0;
  if (!bVar1) {
    pFVar2 = Descriptor::file((Descriptor *)options_local);
    bVar1 = IsBootstrapProto(options_00,pFVar2);
    if (!bVar1) {
      absl::lts_20250127::str_format_internal::
      FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355>::FormatSpecTemplate
                (local_48,"ClassDataLite<%d>");
      local_60 = Descriptor::full_name((Descriptor *)options_local);
      sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size(&local_60);
      local_50 = sVar3 + 1;
      absl::lts_20250127::StrFormat<unsigned_long>(__return_storage_ptr__,local_48,&local_50);
      goto LAB_0163700b;
    }
  }
  std::allocator<char>::allocator();
  local_22 = 1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"ClassDataFull",&local_21);
LAB_0163700b:
  if ((local_22 & 1) != 0) {
    std::allocator<char>::~allocator(&local_21);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ClassDataType(const Descriptor* descriptor,
                          const Options& options) {
  return HasDescriptorMethods(descriptor->file(), options) ||
                 // Boostrap protos are always full, even when lite is forced
                 // via options.
                 IsBootstrapProto(options, descriptor->file())
             ? "ClassDataFull"
             : absl::StrFormat("ClassDataLite<%d>",
                               descriptor->full_name().size() + 1);
}